

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

Region * __thiscall
TuxProc::Process::getRegion(Process *this,char *regionName,int index,uint8_t filter)

{
  Region *pRVar1;
  byte bVar2;
  int iVar3;
  char *__s2;
  Region *region;
  Region *this_00;
  int iVar4;
  
  this_00 = (this->regions).super__Vector_base<TuxProc::Region,_std::allocator<TuxProc::Region>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->regions).super__Vector_base<TuxProc::Region,_std::allocator<TuxProc::Region>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  iVar4 = 0;
  do {
    if (this_00 == pRVar1) {
      return (Region *)0x0;
    }
    bVar2 = Region::getMode(this_00);
    if ((filter & ~bVar2) == 0) {
      __s2 = Region::getFileName(this_00);
      iVar3 = strcmp(regionName,__s2);
      if (iVar3 == 0) {
        if (iVar4 == index) {
          return this_00;
        }
        iVar4 = iVar4 + 1;
      }
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

Region* Process::getRegion(const char* regionName, int index, uint8_t filter)
{
    int counter = 0;
    for (Region& region : regions) {
        if (((filter & region.getMode()) == filter) && (strcmp(regionName, region.getFileName()) == 0)) {
            if (counter == index) return &region;
            else counter++;
        }
    }
    return nullptr;
}